

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O3

MPP_RET av1d_paser_reset(Av1CodecContext *ctx)

{
  void *pvVar1;
  long lVar2;
  
  pvVar1 = ctx->priv_data;
  if (((byte)av1d_debug & 1) != 0) {
    _mpp_log_l(4,"av1d_parser","enter ctx %p\n","av1d_paser_reset",ctx);
  }
  lVar2 = 0;
  do {
    if (*(long *)((long)pvVar1 + lVar2 + 0x398) != 0) {
      av1d_frame_unref((Av1CodecContext *)ctx->priv_data,(AV1Frame *)((long)pvVar1 + lVar2 + 0xa8));
    }
    lVar2 = lVar2 + 0x2f8;
  } while (lVar2 != 0x17c0);
  if (*(long *)((long)pvVar1 + 7000) != 0) {
    av1d_frame_unref((Av1CodecContext *)ctx->priv_data,(AV1Frame *)((long)pvVar1 + 0x1868));
  }
  ctx->frame_header = 0;
  ctx->stream_offset = 0;
  ctx->eos = 0;
  if (((byte)av1d_debug & 1) != 0) {
    _mpp_log_l(4,"av1d_parser","leave ctx %p\n","av1d_paser_reset",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET av1d_paser_reset(Av1CodecContext *ctx)
{
    (void)ctx;
    MPP_RET ret = MPP_OK;
    RK_U32 i = 0;
    AV1Context *s = ctx->priv_data;

    av1d_dbg_func("enter ctx %p\n", ctx);
    for ( i = 0; i < MPP_ARRAY_ELEMS(s->ref); i++) {
        AV1Frame *f = &s->ref[i];

        if (f->ref)
            av1d_frame_unref(ctx, &s->ref[i]);
    }

    if (s->cur_frame.ref) {
        av1d_frame_unref(ctx, &s->cur_frame);
    }

    ctx->frame_header = 0;
    ctx->stream_offset = 0;
    ctx->eos = 0;

    av1d_dbg_func("leave ctx %p\n", ctx);
    return ret;

}